

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O2

Result wabt::ParseInt64(char *s,char *end,uint64_t *out,ParseIntType parse_type)

{
  char cVar1;
  Result RVar2;
  bool bVar3;
  uint64_t local_20;
  
  cVar1 = *s;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    if (parse_type != UnsignedOnly) {
      bVar3 = cVar1 == '-';
      s = s + 1;
      goto LAB_0023054b;
    }
LAB_00230573:
    RVar2.enum_ = Error;
  }
  else {
    bVar3 = false;
LAB_0023054b:
    local_20 = 0;
    RVar2 = ParseUint64(s,end,&local_20);
    if (bVar3) {
      if (0x8000000000000000 < local_20) goto LAB_00230573;
      local_20 = -local_20;
    }
    *out = local_20;
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result ParseInt64(const char* s,
                  const char* end,
                  uint64_t* out,
                  ParseIntType parse_type) {
  bool has_sign = false;
  if (*s == '-' || *s == '+') {
    if (parse_type == ParseIntType::UnsignedOnly) {
      return Result::Error;
    }
    if (*s == '-') {
      has_sign = true;
    }
    s++;
  }
  uint64_t value = 0;
  Result result = ParseUint64(s, end, &value);
  if (has_sign) {
    // abs(INT64_MIN) == INT64_MAX + 1.
    if (value > static_cast<uint64_t>(INT64_MAX) + 1) {
      return Result::Error;
    }
    value = UINT64_MAX - value + 1;
  }
  *out = value;
  return result;
}